

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCore.c
# Opt level: O1

int Map_Mapping(Map_Man_t *p)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  float fVar7;
  timespec ts;
  timespec local_38;
  double local_28;
  
  iVar2 = p->fSwitching;
  if (p->fVerbose != 0) {
    Map_MappingReportChoices(p);
  }
  Map_MappingSetChoiceLevels(p);
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  Map_MappingCuts(p);
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  p->timeCuts = lVar4 + lVar3;
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  Map_MappingTruths(p);
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  p->timeTruth = lVar4 + lVar3;
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  p->fMappingMode = 0;
  iVar1 = Map_MappingMatches(p);
  if (iVar1 == 0) {
    iVar2 = 0;
  }
  else {
    iVar1 = clock_gettime(3,&local_38);
    if (iVar1 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
    }
    p->timeMatch = lVar4 + lVar3;
    Map_MappingSetRefs(p);
    fVar7 = Map_MappingGetArea(p);
    p->AreaBase = fVar7;
    if (p->fVerbose != 0) {
      local_28 = (double)p->fRequiredGlo;
      fVar7 = Map_MappingGetAreaFlow(p);
      iVar1 = 0x9a787d;
      printf("Delay    : %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ",local_28,
             (double)fVar7,(double)p->AreaBase,0,"Delay");
      Abc_Print(iVar1,"%s =","Time");
      Abc_Print(iVar1,"%9.2f sec\n",(double)p->timeMatch / 1000000.0);
    }
    if (p->fAreaRecovery != 0) {
      iVar1 = clock_gettime(3,&local_38);
      if (iVar1 < 0) {
        lVar3 = -1;
      }
      else {
        lVar3 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
      }
      Map_TimeComputeRequiredGlobal(p);
      p->fMappingMode = 1;
      Map_MappingMatches(p);
      Map_MappingSetRefs(p);
      fVar7 = Map_MappingGetArea(p);
      p->AreaFinal = fVar7;
      if (p->fVerbose != 0) {
        local_28 = (double)p->fRequiredGlo;
        fVar7 = Map_MappingGetAreaFlow(p);
        iVar1 = 0x9a78be;
        printf("AreaFlow : %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ",local_28,
               (double)fVar7,(double)p->AreaFinal,
               ((double)(p->AreaBase - p->AreaFinal) * 100.0) / (double)p->AreaBase,"Delay");
        Abc_Print(iVar1,"%s =","Time");
        iVar5 = 3;
        iVar1 = clock_gettime(3,&local_38);
        if (iVar1 < 0) {
          lVar4 = -1;
        }
        else {
          lVar4 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
        }
        Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar4 - lVar3) / 1000000.0);
      }
      iVar1 = clock_gettime(3,&local_38);
      lVar6 = -1;
      lVar4 = -1;
      if (-1 < iVar1) {
        lVar4 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
      }
      p->timeArea = p->timeArea + (lVar4 - lVar3);
      iVar1 = clock_gettime(3,&local_38);
      if (-1 < iVar1) {
        lVar6 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
      }
      if (iVar2 == 0) {
        Map_TimeComputeRequiredGlobal(p);
        p->fMappingMode = 2;
        Map_MappingMatches(p);
        Map_MappingSetRefs(p);
        fVar7 = Map_MappingGetArea(p);
        p->AreaFinal = fVar7;
        if (p->fVerbose != 0) {
          iVar1 = 0x9a78ff;
          printf("Area     : %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ",
                 (double)p->fRequiredGlo,0,(double)fVar7,
                 ((double)(p->AreaBase - fVar7) * 100.0) / (double)p->AreaBase,"Delay");
          Abc_Print(iVar1,"%s =","Time");
          iVar5 = 3;
          iVar1 = clock_gettime(3,&local_38);
          if (iVar1 < 0) {
            lVar3 = -1;
          }
          else {
            lVar3 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
          }
          Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar3 - lVar6) / 1000000.0);
        }
      }
      iVar1 = clock_gettime(3,&local_38);
      lVar4 = -1;
      lVar3 = -1;
      if (-1 < iVar1) {
        lVar3 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
      }
      p->timeArea = p->timeArea + (lVar3 - lVar6);
      iVar1 = clock_gettime(3,&local_38);
      if (-1 < iVar1) {
        lVar4 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
      }
      if (iVar2 == 0) {
        Map_TimeComputeRequiredGlobal(p);
        p->fMappingMode = 3;
        Map_MappingMatches(p);
        Map_MappingSetRefs(p);
        fVar7 = Map_MappingGetArea(p);
        p->AreaFinal = fVar7;
        if (p->fVerbose != 0) {
          iVar2 = 0x9a78ff;
          printf("Area     : %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ",
                 (double)p->fRequiredGlo,0,(double)fVar7,
                 ((double)(p->AreaBase - fVar7) * 100.0) / (double)p->AreaBase,"Delay");
          Abc_Print(iVar2,"%s =","Time");
          iVar1 = 3;
          iVar2 = clock_gettime(3,&local_38);
          if (iVar2 < 0) {
            lVar3 = -1;
          }
          else {
            lVar3 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
          }
          Abc_Print(iVar1,"%9.2f sec\n",(double)(lVar3 - lVar4) / 1000000.0);
        }
      }
      iVar2 = clock_gettime(3,&local_38);
      lVar6 = -1;
      lVar3 = -1;
      if (-1 < iVar2) {
        lVar3 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
      }
      p->timeArea = p->timeArea + (lVar3 - lVar4);
      iVar2 = clock_gettime(3,&local_38);
      if (-1 < iVar2) {
        lVar6 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
      }
      if (p->fSwitching != 0) {
        Map_TimeComputeRequiredGlobal(p);
        p->fMappingMode = 4;
        Map_MappingMatches(p);
        Map_MappingSetRefs(p);
        fVar7 = Map_MappingGetArea(p);
        p->AreaFinal = fVar7;
        if (p->fVerbose != 0) {
          iVar2 = 0x9a7940;
          printf("Switching: %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ",
                 (double)p->fRequiredGlo,0,(double)fVar7,
                 ((double)(p->AreaBase - fVar7) * 100.0) / (double)p->AreaBase,"Delay");
          Abc_Print(iVar2,"%s =","Time");
          iVar1 = 3;
          iVar2 = clock_gettime(3,&local_38);
          if (iVar2 < 0) {
            lVar3 = -1;
          }
          else {
            lVar3 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
          }
          Abc_Print(iVar1,"%9.2f sec\n",(double)(lVar3 - lVar6) / 1000000.0);
        }
        Map_TimeComputeRequiredGlobal(p);
        p->fMappingMode = 4;
        Map_MappingMatches(p);
        Map_MappingSetRefs(p);
        fVar7 = Map_MappingGetArea(p);
        p->AreaFinal = fVar7;
        if (p->fVerbose != 0) {
          iVar2 = 0x9a7940;
          printf("Switching: %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ",
                 (double)p->fRequiredGlo,0,(double)fVar7,
                 ((double)(p->AreaBase - fVar7) * 100.0) / (double)p->AreaBase,"Delay");
          Abc_Print(iVar2,"%s =","Time");
          iVar1 = 3;
          iVar2 = clock_gettime(3,&local_38);
          if (iVar2 < 0) {
            lVar3 = -1;
          }
          else {
            lVar3 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
          }
          Abc_Print(iVar1,"%9.2f sec\n",(double)(lVar3 - lVar6) / 1000000.0);
        }
      }
      iVar2 = clock_gettime(3,&local_38);
      if (iVar2 < 0) {
        lVar3 = -1;
      }
      else {
        lVar3 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
      }
      p->timeArea = p->timeArea + (lVar3 - lVar6);
    }
    if (p->fVerbose != 0) {
      Map_MappingPrintOutputArrivals(p);
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs technology mapping for the given object graph.]

  Description [The object graph is stored in the mapping manager.
  First, the AND nodes that fanout into POs are collected in the DFS order.
  Two preprocessing steps are performed: the k-feasible cuts are computed 
  for each node and the truth tables are computed for each cut. Next, the 
  delay-optimal matches are assigned for each node, followed by several 
  iterations of area recoveryd: using area flow (global optimization) 
  and using exact area at a node (local optimization).]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Map_Mapping( Map_Man_t * p )
{
    int fShowSwitching         = 0;
    int fUseAreaFlow           = 1;
    int fUseExactArea          = !p->fSwitching;
    int fUseExactAreaWithPhase = !p->fSwitching;
    abctime clk;

    //////////////////////////////////////////////////////////////////////
    // perform pre-mapping computations
    if ( p->fVerbose )
        Map_MappingReportChoices( p ); 
    Map_MappingSetChoiceLevels( p ); // should always be called before mapping!
//    return 1;

    // compute the cuts of nodes in the DFS order
    clk = Abc_Clock();
    Map_MappingCuts( p );
    p->timeCuts = Abc_Clock() - clk;
    // derive the truth tables 
    clk = Abc_Clock();
    Map_MappingTruths( p );
    p->timeTruth = Abc_Clock() - clk;
    //////////////////////////////////////////////////////////////////////
//ABC_PRT( "Truths", Abc_Clock() - clk );

    //////////////////////////////////////////////////////////////////////
    // compute the minimum-delay mapping
    clk = Abc_Clock();
    p->fMappingMode = 0;
    if ( !Map_MappingMatches( p ) )
        return 0;
    p->timeMatch = Abc_Clock() - clk;
    // compute the references and collect the nodes used in the mapping
    Map_MappingSetRefs( p );
    p->AreaBase = Map_MappingGetArea( p );
if ( p->fVerbose )
{
printf( "Delay    : %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ", 
                    fShowSwitching? "Switch" : "Delay", 
                    fShowSwitching? Map_MappingGetSwitching(p) : p->fRequiredGlo, 
                    Map_MappingGetAreaFlow(p), p->AreaBase, 0.0 );
ABC_PRT( "Time", p->timeMatch );
}
    //////////////////////////////////////////////////////////////////////

    if ( !p->fAreaRecovery )
    {
        if ( p->fVerbose )
            Map_MappingPrintOutputArrivals( p );
        return 1;
    }

    //////////////////////////////////////////////////////////////////////
    // perform area recovery using area flow
    clk = Abc_Clock();
    if ( fUseAreaFlow )
    {
        // compute the required times
        Map_TimeComputeRequiredGlobal( p );
        // recover area flow
        p->fMappingMode = 1;
        Map_MappingMatches( p );
        // compute the references and collect the nodes used in the mapping
        Map_MappingSetRefs( p );
        p->AreaFinal = Map_MappingGetArea( p );
if ( p->fVerbose )
{
printf( "AreaFlow : %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ", 
                    fShowSwitching? "Switch" : "Delay", 
                    fShowSwitching? Map_MappingGetSwitching(p) : p->fRequiredGlo, 
                    Map_MappingGetAreaFlow(p), p->AreaFinal, 
                    100.0*(p->AreaBase-p->AreaFinal)/p->AreaBase );
ABC_PRT( "Time", Abc_Clock() - clk );
}
    }
    p->timeArea += Abc_Clock() - clk;
    //////////////////////////////////////////////////////////////////////

    //////////////////////////////////////////////////////////////////////
    // perform area recovery using exact area
    clk = Abc_Clock();
    if ( fUseExactArea )
    {
        // compute the required times
        Map_TimeComputeRequiredGlobal( p );
        // recover area
        p->fMappingMode = 2;
        Map_MappingMatches( p );
        // compute the references and collect the nodes used in the mapping
        Map_MappingSetRefs( p );
        p->AreaFinal = Map_MappingGetArea( p );
if ( p->fVerbose )
{
printf( "Area     : %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ", 
                    fShowSwitching? "Switch" : "Delay", 
                    fShowSwitching? Map_MappingGetSwitching(p) : p->fRequiredGlo, 
                    0.0, p->AreaFinal, 
                    100.0*(p->AreaBase-p->AreaFinal)/p->AreaBase );
ABC_PRT( "Time", Abc_Clock() - clk );
}
    }
    p->timeArea += Abc_Clock() - clk;
    //////////////////////////////////////////////////////////////////////

    //////////////////////////////////////////////////////////////////////
    // perform area recovery using exact area
    clk = Abc_Clock();
    if ( fUseExactAreaWithPhase )
    {
        // compute the required times
        Map_TimeComputeRequiredGlobal( p );
        // recover area
        p->fMappingMode = 3;
        Map_MappingMatches( p );
        // compute the references and collect the nodes used in the mapping
        Map_MappingSetRefs( p );
        p->AreaFinal = Map_MappingGetArea( p );
if ( p->fVerbose )
{
printf( "Area     : %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ", 
                    fShowSwitching? "Switch" : "Delay", 
                    fShowSwitching? Map_MappingGetSwitching(p) : p->fRequiredGlo, 
                    0.0, p->AreaFinal, 
                    100.0*(p->AreaBase-p->AreaFinal)/p->AreaBase );
ABC_PRT( "Time", Abc_Clock() - clk );
}
    }
    p->timeArea += Abc_Clock() - clk;
    //////////////////////////////////////////////////////////////////////

    //////////////////////////////////////////////////////////////////////
    // perform area recovery using exact area
    clk = Abc_Clock();
    if ( p->fSwitching )
    {
        // compute the required times
        Map_TimeComputeRequiredGlobal( p );
        // recover switching activity
        p->fMappingMode = 4;
        Map_MappingMatches( p );
        // compute the references and collect the nodes used in the mapping
        Map_MappingSetRefs( p );
        p->AreaFinal = Map_MappingGetArea( p );
if ( p->fVerbose )
{
printf( "Switching: %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ", 
                    fShowSwitching? "Switch" : "Delay", 
                    fShowSwitching? Map_MappingGetSwitching(p) : p->fRequiredGlo, 
                    0.0, p->AreaFinal, 
                    100.0*(p->AreaBase-p->AreaFinal)/p->AreaBase );
ABC_PRT( "Time", Abc_Clock() - clk );
}

        // compute the required times
        Map_TimeComputeRequiredGlobal( p );
        // recover switching activity
        p->fMappingMode = 4;
        Map_MappingMatches( p );
        // compute the references and collect the nodes used in the mapping
        Map_MappingSetRefs( p );
        p->AreaFinal = Map_MappingGetArea( p );
if ( p->fVerbose )
{
printf( "Switching: %s = %8.2f  Flow = %11.1f  Area = %11.1f  %4.1f %%   ", 
                    fShowSwitching? "Switch" : "Delay", 
                    fShowSwitching? Map_MappingGetSwitching(p) : p->fRequiredGlo, 
                    0.0, p->AreaFinal, 
                    100.0*(p->AreaBase-p->AreaFinal)/p->AreaBase );
ABC_PRT( "Time", Abc_Clock() - clk );
}
    }
    p->timeArea += Abc_Clock() - clk;
    //////////////////////////////////////////////////////////////////////

    // print the arrival times of the latest outputs
    if ( p->fVerbose )
        Map_MappingPrintOutputArrivals( p );
    return 1;
}